

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ObtainHandleForObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,IPalObject *pobj,
          DWORD dwRightsRequested,bool fInheritHandle,IPalProcess *pProcessForHandle,
          HANDLE *pNewHandle)

{
  PAL_ERROR palError;
  IPalProcess *pProcessForHandle_local;
  bool fInheritHandle_local;
  DWORD dwRightsRequested_local;
  IPalObject *pobj_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x2e7);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pobj == (IPalObject *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x2e8);
    fprintf(_stderr,"Expression: NULL != pobj\n");
  }
  if (pNewHandle == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x2e9);
    fprintf(_stderr,"Expression: NULL != pNewHandle\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    if (pProcessForHandle == (IPalProcess *)0x0) {
      this_local._4_4_ =
           CSimpleHandleManager::AllocateHandle
                     (&this->m_HandleManager,pthr,pobj,dwRightsRequested,fInheritHandle,pNewHandle);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","ObtainHandleForObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x2fd);
      fprintf(_stderr,"Caller to ObtainHandleForObject provided a process\n");
      this_local._4_4_ = 0x78;
    }
    return this_local._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR   
CSharedMemoryObjectManager::ObtainHandleForObject(
    CPalThread *pthr,
    IPalObject *pobj,
    DWORD dwRightsRequested,
    bool fInheritHandle,
    IPalProcess *pProcessForHandle,     // IN, OPTIONAL
    HANDLE *pNewHandle                  // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pobj);
    _ASSERTE(NULL != pNewHandle);

    ENTRY("CSharedMemoryObjectManager::ObtainHandleForObject "
        "(this=%p, pthr=%p, pobj=%p, dwRightsRequested=%d, "
        "fInheritHandle=%p, pProcessForHandle=%p, pNewHandle=%p)\n",
        this,
        pthr,
        pobj,
        dwRightsRequested,
        fInheritHandle,
        pProcessForHandle,
        pNewHandle
        );

    if (NULL != pProcessForHandle)
    {
        //
        // Not yet supported
        //

        ASSERT("Caller to ObtainHandleForObject provided a process\n");
        return ERROR_CALL_NOT_IMPLEMENTED;
    }

    palError = m_HandleManager.AllocateHandle(
        pthr,
        pobj,
        dwRightsRequested,
        fInheritHandle,
        pNewHandle
        );

    LOGEXIT("CSharedMemoryObjectManager::ObtainHandleForObject return %d\n", palError);

    return palError;    
}